

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswMan.c
# Opt level: O3

int Ssw_ManCountEquivs(Ssw_Man_t *p)

{
  Vec_Ptr_t *pVVar1;
  void *pvVar2;
  Aig_Obj_t **ppAVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  
  pVVar1 = p->pAig->vObjs;
  lVar5 = (long)pVVar1->nSize;
  if (0 < lVar5) {
    lVar6 = 0;
    iVar4 = 0;
    do {
      pvVar2 = pVVar1->pArray[lVar6];
      if (pvVar2 != (void *)0x0) {
        ppAVar3 = p->pAig->pReprs;
        if (ppAVar3 == (Aig_Obj_t **)0x0) {
          uVar7 = 0;
        }
        else {
          uVar7 = (uint)(ppAVar3[*(int *)((long)pvVar2 + 0x24)] != (Aig_Obj_t *)0x0);
        }
        iVar4 = iVar4 + uVar7;
      }
      lVar6 = lVar6 + 1;
    } while (lVar5 != lVar6);
    return iVar4;
  }
  return 0;
}

Assistant:

int Ssw_ManCountEquivs( Ssw_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i, nEquivs = 0;
    Aig_ManForEachObj( p->pAig, pObj, i )
        nEquivs += ( Aig_ObjRepr(p->pAig, pObj) != NULL );
    return nEquivs;
}